

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.cpp
# Opt level: O3

XXH_errorcode duckdb_zstd::XXH64_update(XXH64_state_t *state_in,void *input,size_t len)

{
  uint uVar1;
  ulong uVar2;
  unsigned_long_long uVar3;
  unsigned_long_long uVar4;
  long *plVar5;
  unsigned_long_long uVar6;
  unsigned_long_long uVar7;
  ulong uVar8;
  
  state_in->total_len = state_in->total_len + len;
  uVar1 = state_in->memsize;
  uVar2 = (ulong)uVar1;
  if (uVar2 + len < 0x20) {
    if (input != (void *)0x0) {
      switchD_00b041bd::default((void *)((long)state_in->mem64 + uVar2),input,len);
      uVar1 = state_in->memsize;
    }
    uVar2 = (ulong)((int)len + uVar1);
  }
  else {
    plVar5 = (long *)(len + (long)input);
    if (uVar1 != 0) {
      switchD_00b041bd::default((void *)((long)state_in->mem64 + uVar2),input,(ulong)(0x20 - uVar1))
      ;
      uVar2 = state_in->mem64[0] * -0x3d4d51c2d82b14b1 + state_in->v1;
      state_in->v1 = (uVar2 * 0x80000000 | uVar2 >> 0x21) * -0x61c8864e7a143579;
      uVar2 = state_in->mem64[1] * -0x3d4d51c2d82b14b1 + state_in->v2;
      state_in->v2 = (uVar2 * 0x80000000 | uVar2 >> 0x21) * -0x61c8864e7a143579;
      uVar2 = state_in->mem64[2] * -0x3d4d51c2d82b14b1 + state_in->v3;
      state_in->v3 = (uVar2 * 0x80000000 | uVar2 >> 0x21) * -0x61c8864e7a143579;
      uVar2 = state_in->mem64[3] * -0x3d4d51c2d82b14b1 + state_in->v4;
      state_in->v4 = (uVar2 * 0x80000000 | uVar2 >> 0x21) * -0x61c8864e7a143579;
      input = (void *)((long)input + (ulong)(0x20 - state_in->memsize));
      state_in->memsize = 0;
    }
    if ((long *)((long)input + 0x20) <= plVar5) {
      uVar3 = state_in->v1;
      uVar4 = state_in->v2;
      uVar7 = state_in->v3;
      uVar6 = state_in->v4;
      do {
        uVar2 = *input * -0x3d4d51c2d82b14b1 + uVar3;
        uVar3 = (uVar2 * 0x80000000 | uVar2 >> 0x21) * -0x61c8864e7a143579;
        uVar2 = *(long *)((long)input + 8) * -0x3d4d51c2d82b14b1 + uVar4;
        uVar8 = *(long *)((long)input + 0x10) * -0x3d4d51c2d82b14b1 + uVar7;
        uVar4 = (uVar2 * 0x80000000 | uVar2 >> 0x21) * -0x61c8864e7a143579;
        uVar7 = (uVar8 * 0x80000000 | uVar8 >> 0x21) * -0x61c8864e7a143579;
        uVar2 = *(long *)((long)input + 0x18) * -0x3d4d51c2d82b14b1 + uVar6;
        uVar6 = (uVar2 * 0x80000000 | uVar2 >> 0x21) * -0x61c8864e7a143579;
        input = (void *)((long)input + 0x20);
      } while (input <= plVar5 + -4);
      state_in->v1 = uVar3;
      state_in->v2 = uVar4;
      state_in->v3 = uVar7;
      state_in->v4 = uVar6;
    }
    if (plVar5 <= input) {
      return XXH_OK;
    }
    uVar2 = (long)plVar5 - (long)input;
    switchD_00b041bd::default(state_in->mem64,input,uVar2);
  }
  state_in->memsize = (uint)uVar2;
  return XXH_OK;
}

Assistant:

XXH_PUBLIC_API XXH_errorcode XXH64_update (XXH64_state_t* state_in, const void* input, size_t len)
{
    XXH_endianess endian_detected = (XXH_endianess)XXH_CPU_LITTLE_ENDIAN;

    if ((endian_detected==XXH_littleEndian) || XXH_FORCE_NATIVE_FORMAT)
        return XXH64_update_endian(state_in, input, len, XXH_littleEndian);
    else
        return XXH64_update_endian(state_in, input, len, XXH_bigEndian);
}